

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_mpbe.c
# Opt level: O3

void gga_x_mpbe_init(xc_func_type *p)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  func_reference_type *pfVar4;
  long lVar5;
  long lVar6;
  undefined8 *puVar7;
  xc_func_info_type *pxVar8;
  long lVar9;
  double *extraout_RDX;
  long lVar10;
  long in_RSI;
  long *plVar11;
  long *in_R8;
  double *pdVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  func_reference_type *pfVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  
  plVar11 = (long *)0x20;
  puVar7 = (undefined8 *)malloc(0x20);
  p->params = puVar7;
  pxVar8 = p->info;
  if (pxVar8->number == 0x7a) {
    *puVar7 = 0x3fc4189374bc6a7f;
    puVar7[1] = 0x3fcc18e757928e0d;
    puVar7[2] = 0xbf8eb851eb851eb8;
    puVar7[3] = 0;
    return;
  }
  gga_x_mpbe_init_cold_1();
  if (in_RSI != 0) {
    lVar5 = plVar11[1];
    lVar6 = plVar11[9];
    lVar10 = 0;
    pdVar12 = extraout_RDX;
    do {
      dVar14 = *pdVar12;
      if ((int)lVar5 == 2) {
        dVar14 = dVar14 + pdVar12[1];
      }
      dVar1 = (double)plVar11[0x30];
      if (dVar1 <= dVar14) {
        dVar14 = *pdVar12;
        if (*pdVar12 <= dVar1) {
          dVar14 = dVar1;
        }
        dVar25 = 0.0;
        if (dVar1 < dVar14 * 0.5) {
          dVar1 = (double)plVar11[0x31];
          pfVar19 = (func_reference_type *)((double)plVar11[0x32] * (double)plVar11[0x32]);
          pfVar4 = pxVar8->refs[*(int *)((long)plVar11 + 0x4c) * lVar10 + -3];
          if ((double)pxVar8->refs[*(int *)((long)plVar11 + 0x4c) * lVar10 + -3] <= (double)pfVar19)
          {
            pfVar4 = pfVar19;
          }
          dVar25 = (double)(-(ulong)(dVar1 < 1.0) & 0x3ff0000000000000 |
                           ~-(ulong)(dVar1 < 1.0) & (ulong)(dVar1 + -1.0 + 1.0));
          uVar13 = -(ulong)(dVar25 <= dVar1);
          dVar25 = (double)(uVar13 & (ulong)dVar1 | ~uVar13 & (ulong)dVar25);
          dVar15 = cbrt(dVar25);
          pdVar2 = (double *)plVar11[0x2f];
          dVar1 = pdVar2[1];
          dVar16 = cbrt(9.869604401089358);
          dVar23 = 1.0 / (dVar16 * dVar16);
          dVar17 = cbrt(dVar14);
          auVar20._0_8_ = 1.0 / dVar17;
          dVar26 = dVar14 * dVar14;
          dVar24 = (1.0 / (dVar17 * dVar17)) / dVar26;
          dVar26 = dVar26 * dVar26;
          auVar20._8_8_ = 0x3ff0000000000000;
          dVar18 = (*pdVar2 * 1.8171205928321397 * dVar23 * (double)pfVar4 * 1.5874010519681996 *
                   dVar24) / 24.0 + 1.0;
          auVar21._8_8_ = dVar18 * dVar18;
          auVar21._0_8_ = dVar26 * dVar14;
          auVar21 = divpd(auVar20,auVar21);
          auVar22._0_8_ =
               (1.0 / dVar18) *
               dVar24 * (double)pfVar4 * 1.5874010519681996 * dVar1 * 1.8171205928321397 * dVar23;
          auVar22._8_8_ =
               auVar21._8_8_ * auVar21._0_8_ *
               (double)pfVar4 * (double)pfVar4 * 1.2599210498948732 *
               pdVar2[2] * 3.3019272488946267 * ((1.0 / dVar16) / 9.869604401089358);
          auVar21 = divpd(auVar22,_DAT_00f5f270);
          dVar25 = dVar15 * dVar25 * dVar17 * -0.36927938319101117 *
                   (((1.0 / (dVar18 * dVar18 * dVar18)) *
                    pdVar2[3] * 0.010265982254684336 *
                    (double)pfVar4 * (double)pfVar4 * (double)pfVar4 * (1.0 / (dVar26 * dVar26))) /
                    576.0 + auVar21._8_8_ + auVar21._0_8_ + 1.0);
          dVar25 = dVar25 + dVar25;
        }
        lVar3 = *in_R8;
        if ((lVar3 != 0) && ((*(byte *)(*plVar11 + 0x40) & 1) != 0)) {
          lVar9 = (int)plVar11[0xb] * lVar10;
          *(double *)(lVar3 + lVar9 * 8) = dVar25 + *(double *)(lVar3 + lVar9 * 8);
        }
      }
      lVar10 = lVar10 + 1;
      pdVar12 = pdVar12 + (int)lVar6;
    } while (in_RSI != lVar10);
  }
  return;
}

Assistant:

static void
gga_x_mpbe_init(xc_func_type *p)
{
  gga_x_mpbe_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_x_mpbe_params));
  params = (gga_x_mpbe_params *) (p->params);

  switch(p->info->number){
  case XC_GGA_X_MPBE:
    params->a  =  0.157;
    params->c1 =  0.21951;
    params->c2 = -0.015;
    params->c3 =  0.0;
    break;
  default:
    fprintf(stderr, "Internal error in gga_x_mpbe\n");
    exit(1);
  }
}